

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

int get_exts(void)

{
  char **ppcVar1;
  GLubyte *__s;
  size_t sVar2;
  char *__dest;
  char *local_str;
  size_t len;
  char *gl_str_tmp;
  char **tmp_exts_i;
  uint index;
  
  if (max_loaded_major < 3) {
    exts = (char *)(*glad_glGetString)(0x1f03);
  }
  else {
    num_exts_i = 0;
    (*glad_glGetIntegerv)(0x821d,&num_exts_i);
    ppcVar1 = exts_i;
    if ((0 < num_exts_i) &&
       (ppcVar1 = (char **)realloc(exts_i,(long)num_exts_i << 3), ppcVar1 == (char **)0x0)) {
      return 0;
    }
    exts_i = ppcVar1;
    if (exts_i == (char **)0x0) {
      return 0;
    }
    for (tmp_exts_i._0_4_ = 0; (uint)tmp_exts_i < (uint)num_exts_i;
        tmp_exts_i._0_4_ = (uint)tmp_exts_i + 1) {
      __s = (*glad_glGetStringi)(0x1f03,(uint)tmp_exts_i);
      sVar2 = strlen((char *)__s);
      __dest = (char *)malloc(sVar2 + 1);
      if (__dest != (char *)0x0) {
        memcpy(__dest,__s,sVar2 + 1);
      }
      exts_i[(uint)tmp_exts_i] = __dest;
    }
  }
  return 1;
}

Assistant:

static int get_exts(void) {
#ifdef _GLAD_IS_SOME_NEW_VERSION
    if(max_loaded_major < 3) {
#endif
        exts = (const char *)glGetString(GL_EXTENSIONS);
#ifdef _GLAD_IS_SOME_NEW_VERSION
    } else {
        unsigned int index;

        num_exts_i = 0;
        glGetIntegerv(GL_NUM_EXTENSIONS, &num_exts_i);
        if (num_exts_i > 0) {
            char **tmp_exts_i = (char **)realloc((void *)exts_i, (size_t)num_exts_i * (sizeof *exts_i));
            if (tmp_exts_i == NULL) {
                return 0;
            }
            exts_i = tmp_exts_i;
        }

        if (exts_i == NULL) {
            return 0;
        }

        for(index = 0; index < (unsigned)num_exts_i; index++) {
            const char *gl_str_tmp = (const char*)glGetStringi(GL_EXTENSIONS, index);
            size_t len = strlen(gl_str_tmp);

            char *local_str = (char*)malloc((len+1) * sizeof(char));
            if(local_str != NULL) {
                memcpy(local_str, gl_str_tmp, (len+1) * sizeof(char));
            }
            exts_i[index] = local_str;
        }
    }
#endif
    return 1;
}